

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_1::OptionsToInterpret::OptionsToInterpret
          (OptionsToInterpret *this,string *ns,string *el,vector<int,_std::allocator<int>_> *path,
          Message *orig_opt,Message *opt)

{
  std::__cxx11::string::string((string *)this,(string *)ns);
  std::__cxx11::string::string((string *)&this->element_name,(string *)el);
  std::vector<int,_std::allocator<int>_>::vector(&this->element_path,path);
  this->original_options = orig_opt;
  this->options = opt;
  return;
}

Assistant:

OptionsToInterpret(const std::string& ns, const std::string& el,
                     const std::vector<int>& path, const Message* orig_opt,
                     Message* opt)
      : name_scope(ns),
        element_name(el),
        element_path(path),
        original_options(orig_opt),
        options(opt) {}